

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard.cpp
# Opt level: O1

void __thiscall gepard::Gepard::~Gepard(Gepard *this)

{
  GepardEngine *this_00;
  pointer pcVar1;
  
  this_00 = this->_engine;
  if (this_00 != (GepardEngine *)0x0) {
    GepardEngine::~GepardEngine(this_00);
    operator_delete(this_00);
  }
  pcVar1 = (this->strokeStyle).data._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->strokeStyle).data.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->fillStyle).data._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->fillStyle).data.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->miterLimit).data._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->miterLimit).data.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->lineJoin).data._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->lineJoin).data.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->lineCap).data._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->lineCap).data.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->lineWidth).data._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->lineWidth).data.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Gepard::~Gepard()
{
    if (_engine) {
        delete _engine;
    }
}